

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_serializer_test.cc
# Opt level: O1

void __thiscall
prometheus::anon_unknown_0::TextSerializerTest_shouldEscapeNewline_Test::TestBody
          (TextSerializerTest_shouldEscapeNewline_Test *this)

{
  long *plVar1;
  pointer pcVar2;
  StringLike<std::__cxx11::basic_string<char>_> *substring;
  char *message;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  undefined1 local_d0 [32];
  _Alloc_hider local_b0;
  char local_a0 [16];
  char local_90 [8];
  undefined8 *local_88;
  AssertHelper local_80 [2];
  undefined1 local_70 [16];
  undefined1 *local_60;
  undefined1 local_50 [16];
  PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  
  plVar1 = (long *)(local_d0 + 0x10);
  local_d0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"k","");
  local_b0._M_p = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"v\nv","");
  std::vector<prometheus::ClientMetric::Label,_std::allocator<prometheus::ClientMetric::Label>_>::
  resize(&(this->super_TextSerializerTest).metric.label,1,(value_type *)local_d0);
  if (local_b0._M_p != local_a0) {
    operator_delete(local_b0._M_p);
  }
  if ((long *)local_d0._0_8_ != plVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  pcVar2 = (this->super_TextSerializerTest).name._M_dataplus._M_p;
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,
             pcVar2 + (this->super_TextSerializerTest).name._M_string_length);
  std::__cxx11::string::append((char *)&local_60);
  testing::HasSubstr<std::__cxx11::string>(&local_40,(testing *)&local_60,substring);
  local_d0._0_8_ = plVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_d0,local_40.impl_.substring_._M_dataplus._M_p,
             local_40.impl_.substring_._M_dataplus._M_p + local_40.impl_.substring_._M_string_length
            );
  local_80[0].data_ = (AssertHelperData *)local_70;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_80,local_d0._0_8_,(pointer)(local_d0._0_8_ + local_d0._8_8_));
  if ((long *)local_d0._0_8_ != plVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  (anonymous_namespace)::TextSerializerTest::Serialize_abi_cxx11_((string *)local_d0,this,Gauge);
  testing::internal::
  PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::HasSubstrMatcher<std::__cxx11::string>>>
  ::operator()(local_90,(char *)local_80,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "Serialize(MetricType::Gauge)");
  if ((long *)local_d0._0_8_ != plVar1) {
    operator_delete((void *)local_d0._0_8_);
  }
  if (local_80[0].data_ != (AssertHelperData *)local_70) {
    operator_delete(local_80[0].data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.impl_.substring_._M_dataplus._M_p != &local_40.impl_.substring_.field_2) {
    operator_delete(local_40.impl_.substring_._M_dataplus._M_p);
  }
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  if (local_90[0] == '\0') {
    testing::Message::Message((Message *)local_d0);
    if (local_88 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_88;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/text_serializer_test.cc"
               ,0x3f,message);
    testing::internal::AssertHelper::operator=(local_80,(Message *)local_d0);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    if ((long *)local_d0._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_d0._0_8_ + 8))();
    }
  }
  if (local_88 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_88 != local_88 + 2) {
      operator_delete((undefined8 *)*local_88);
    }
    operator_delete(local_88);
  }
  return;
}

Assistant:

TEST_F(TextSerializerTest, shouldEscapeNewline) {
  metric.label.resize(1, ClientMetric::Label{"k", "v\nv"});
  EXPECT_THAT(Serialize(MetricType::Gauge),
              testing::HasSubstr(name + "{k=\"v\\nv\"}"));
}